

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
PS2KeyboardAnalyzerSettings::UpdateInterfacesFromSettings(PS2KeyboardAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mClockChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mDeviceType);
  return;
}

Assistant:

void PS2KeyboardAnalyzerSettings::UpdateInterfacesFromSettings()
{
    mClockChannelInterface->SetChannel( mClockChannel );
    mDataChannelInterface->SetChannel( mDataChannel );
    mDeviceTypeInterface->SetNumber( mDeviceType );
}